

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O3

void __thiscall imgtogb::StdOutput::~StdOutput(StdOutput *this)

{
  pointer pcVar1;
  
  (this->super_CmdLineOutput)._vptr_CmdLineOutput = (_func_int **)&PTR__StdOutput_00156808;
  pcVar1 = (this->author)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->author).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->basename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->basename).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

StdOutput(const std::string &basename, const std::string &author)
			: basename(basename)
			, author(author)
			{ }